

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O0

int archive_write_lzop_options(archive_write_filter *f,char *key,char *value)

{
  int *piVar1;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  write_lzop *data;
  int local_4;
  
  piVar1 = *(int **)(in_RDI + 0x40);
  iVar2 = strcmp(in_RSI,"compression-level");
  if (iVar2 == 0) {
    if ((((in_RDX == (char *)0x0) || (*in_RDX < '1')) || ('9' < *in_RDX)) || (in_RDX[1] != '\0')) {
      local_4 = -0x14;
    }
    else {
      *piVar1 = *in_RDX + -0x30;
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x14;
  }
  return local_4;
}

Assistant:

static int
archive_write_lzop_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct write_lzop *data = (struct write_lzop *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL || !(value[0] >= '1' && value[0] <= '9') ||
		    value[1] != '\0')
			return (ARCHIVE_WARN);
		data->compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}